

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint32_t uVar1;
  uint32_t uVar2;
  char *pcVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  trico_stream_type tVar7;
  uint32_t nr_of_vertices;
  uint32_t nr_of_triangles;
  uint32_t uVar8;
  ulong uVar9;
  FILE *__stream;
  uint8_t *data;
  size_t sVar10;
  void *a;
  long lVar11;
  long lVar12;
  char *__format;
  char *pcVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  bool bVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  uint32_t *tria_indices;
  float *texcoords;
  uint32_t *vertex_colors;
  float *vertex_normals;
  float *triangle_normals;
  uint16_t *attributes;
  uint8_t *local_4d8;
  long local_4d0;
  float *vertices;
  ulong local_498;
  char cStack_439;
  char new_filename [1024];
  
  if (argc < 3) {
    puts("Usage: trico_decoder -i <input> [options]\n");
    puts("Options:");
    puts("  -i <input>           input file name.");
    puts("  -o <output>          output file name of type stl or ply.");
    putchar(10);
    return -1;
  }
  bVar4 = false;
  pcVar13 = (char *)0x0;
  for (iVar16 = 1; iVar16 < argc; iVar16 = iVar16 + 2) {
    pcVar3 = argv[iVar16];
    if (*pcVar3 != '-') {
LAB_001023f9:
      __format = "Unknown command %s\n";
      pcVar13 = pcVar3;
      goto LAB_00102403;
    }
    if ((pcVar3[1] == 'i') && (pcVar3[2] == '\0')) {
      if (iVar16 == argc + -1) {
        pcVar13 = "I expect a filename after command -i";
        goto LAB_0010269c;
      }
      pcVar13 = argv[(long)iVar16 + 1];
    }
    else {
      if ((pcVar3[1] != 'o') || (pcVar3[2] != '\0')) goto LAB_001023f9;
      if (iVar16 == argc + -1) {
        pcVar13 = "I expect a filename after command -o";
        goto LAB_0010269c;
      }
      pcVar3 = argv[(long)iVar16 + 1];
      for (uVar9 = 0; pcVar3[uVar9] != '\0'; uVar9 = uVar9 + 1) {
        new_filename[uVar9] = pcVar3[uVar9];
      }
      new_filename[uVar9 & 0xffffffff] = '\0';
      bVar4 = true;
    }
  }
  if (pcVar13 == (char *)0x0) {
    pcVar13 = "An input file name is required";
LAB_0010269c:
    puts(pcVar13);
    return -1;
  }
  iVar16 = stat(pcVar13,(stat *)&vertices);
  uVar9 = -(ulong)(iVar16 != 0) | local_498;
  if ((long)uVar9 < 0) {
    __format = "There was an error reading file %s\n";
  }
  else {
    __stream = fopen(pcVar13,"rb");
    if (__stream == (FILE *)0x0) {
      __format = "Cannot open file: %s\n";
    }
    else {
      data = (uint8_t *)malloc(uVar9);
      sVar10 = fread(data,1,uVar9,__stream);
      if (sVar10 != uVar9) {
        printf("There was an error reading file %s\n",pcVar13);
        fclose(__stream);
        return -1;
      }
      local_4d0 = 1;
      fclose(__stream);
      a = trico_open_archive_for_reading(data,uVar9);
      if (a != (void *)0x0) {
        vertices = (float *)0x0;
        tria_indices = (uint32_t *)0x0;
        triangle_normals = (float *)0x0;
        vertex_normals = (float *)0x0;
        vertex_colors = (uint32_t *)0x0;
        texcoords = (float *)0x0;
        attributes = (uint16_t *)0x0;
        local_4d8 = data;
        tVar7 = trico_get_next_stream_type(a);
        nr_of_triangles = 0;
        nr_of_vertices = 0;
        do {
          switch(tVar7) {
          case trico_empty:
            goto switchD_00102506_caseD_0;
          case trico_vertex_float_stream:
            nr_of_vertices = trico_get_number_of_vertices(a);
            vertices = (float *)malloc((ulong)(nr_of_vertices * 3) << 2);
            iVar16 = trico_read_vertices(a,&vertices);
            if (iVar16 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(local_4d8);
              pcVar13 = "Something went wrong when reading the vertices";
              goto LAB_0010269c;
            }
            break;
          default:
            trico_skip_next_stream(a);
            break;
          case trico_triangle_uint32_stream:
            nr_of_triangles = trico_get_number_of_triangles(a);
            tria_indices = (uint32_t *)malloc((ulong)(nr_of_triangles * 3) << 2);
            iVar16 = trico_read_triangles(a,&tria_indices);
            if (iVar16 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(local_4d8);
              pcVar13 = "Something went wrong when reading the triangles";
              goto LAB_0010269c;
            }
            break;
          case trico_uv_per_triangle_float_stream:
            uVar8 = trico_get_number_of_uvs(a);
            texcoords = (float *)malloc((ulong)(uVar8 * 2) << 2);
            iVar16 = trico_read_uv_per_triangle(a,&texcoords);
            if (iVar16 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(local_4d8);
              pcVar13 = "Something went wrong when reading the texture coordinates";
              goto LAB_0010269c;
            }
            break;
          case trico_vertex_normal_float_stream:
            uVar8 = trico_get_number_of_normals(a);
            vertex_normals = (float *)malloc((ulong)(uVar8 * 3) << 2);
            iVar16 = trico_read_vertex_normals(a,&vertex_normals);
            if (iVar16 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(local_4d8);
              pcVar13 = "Something went wrong when reading the vertex normals";
              goto LAB_0010269c;
            }
            break;
          case trico_triangle_normal_float_stream:
            uVar8 = trico_get_number_of_normals(a);
            triangle_normals = (float *)malloc((ulong)(uVar8 * 3) << 2);
            iVar16 = trico_read_triangle_normals(a,&triangle_normals);
            if (iVar16 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(local_4d8);
              pcVar13 = "Something went wrong when reading the triangle normals";
              goto LAB_0010269c;
            }
            break;
          case trico_vertex_color_stream:
            uVar8 = trico_get_number_of_colors(a);
            vertex_colors = (uint32_t *)malloc((ulong)uVar8 << 2);
            iVar16 = trico_read_vertex_colors(a,&vertex_colors);
            if (iVar16 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(local_4d8);
              pcVar13 = "Something went wrong when reading the vertex colors";
              goto LAB_0010269c;
            }
            break;
          case trico_attribute_uint16_stream:
            uVar8 = trico_get_number_of_attributes(a);
            attributes = (uint16_t *)malloc((ulong)uVar8 * 2);
            iVar16 = trico_read_attributes_uint16(a,&attributes);
            if (iVar16 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(local_4d8);
              pcVar13 = "Something went wrong when reading the attributes";
              goto LAB_0010269c;
            }
          }
          tVar7 = trico_get_next_stream_type(a);
        } while( true );
      }
      __format = "The input file %s is not a trico archive.\n";
    }
  }
  goto LAB_00102403;
switchD_00102506_caseD_0:
  trico_close_archive(a);
  free(local_4d8);
  if (bVar4) {
    lVar12 = 0x100000000;
    for (lVar11 = 0; new_filename[lVar11] != '\0'; lVar11 = lVar11 + 1) {
      lVar12 = lVar12 + 0x100000000;
    }
    bVar20 = false;
    lVar15 = lVar11;
    do {
      if (lVar15 == 1) {
        lVar14 = 0;
        goto LAB_00102a20;
      }
      lVar12 = lVar12 + -0x100000000;
      lVar14 = lVar15 + -1;
      lVar18 = lVar15 + -1;
      lVar15 = lVar14;
    } while (new_filename[lVar18] != '.');
    local_4d0 = lVar12 >> 0x20;
LAB_00102a20:
    if ((((int)lVar14 + 4 == (int)lVar11 && new_filename[(int)lVar14] == '.') &&
        ((byte)(new_filename[local_4d0] | 0x20U) == 0x73)) &&
       ((byte)(new_filename[local_4d0 + 1] | 0x20U) == 0x74)) {
      bVar20 = (new_filename[local_4d0 + 2] + 0xb4U & 0xdf) == 0;
    }
    lVar12 = 0x100000000;
    for (lVar11 = 0; new_filename[lVar11] != '\0'; lVar11 = lVar11 + 1) {
      lVar12 = lVar12 + 0x100000000;
    }
    lVar15 = 1;
    bVar21 = false;
    lVar14 = lVar11;
    do {
      if (lVar14 == 1) {
        lVar18 = 0;
        goto LAB_00102abe;
      }
      lVar12 = lVar12 + -0x100000000;
      lVar18 = lVar14 + -1;
      lVar6 = lVar14 + -1;
      lVar14 = lVar18;
    } while (new_filename[lVar6] != '.');
    lVar15 = lVar12 >> 0x20;
LAB_00102abe:
    if ((((int)lVar18 + 4 == (int)lVar11 && new_filename[(int)lVar18] == '.') &&
        ((byte)(new_filename[lVar15] | 0x20U) == 0x70)) &&
       ((byte)(new_filename[lVar15 + 1] | 0x20U) == 0x6c)) {
      bVar21 = (new_filename[lVar15 + 2] + 0xa7U & 0xdf) == 0;
    }
  }
  else {
    bVar21 = false;
    bVar20 = false;
  }
  if (!bVar20 && !bVar21) {
    bVar20 = (texcoords == (float *)0x0 && vertex_colors == (uint32_t *)0x0) &&
             vertex_normals == (float *)0x0;
    bVar21 = (texcoords != (float *)0x0 || vertex_colors != (uint32_t *)0x0) ||
             vertex_normals != (float *)0x0;
  }
  if (!bVar4) {
    lVar11 = 0;
    if (bVar21) {
      for (uVar9 = 0; uVar5 = uVar9, pcVar13[uVar9] != '\0'; uVar9 = uVar9 + 1) {
        new_filename[uVar9] = pcVar13[uVar9];
        lVar11 = lVar11 + -0x100000000;
      }
      do {
        lVar12 = lVar11;
        if (uVar5 - 1 == 0) break;
        lVar15 = uVar5 - 1;
        lVar11 = lVar12 + 0x100000000;
        uVar5 = uVar5 - 1;
      } while (new_filename[lVar15] != '.');
      if (new_filename[-0x100000000 - lVar12 >> 0x20] == '.') {
        lVar11 = -lVar12 >> 0x20;
        pcVar13 = new_filename + lVar11 + 3;
        (new_filename + lVar11)[0] = 'p';
        (new_filename + lVar11)[1] = 'l';
        new_filename[lVar11 + 2] = 'y';
      }
      else {
        pcVar13 = new_filename + (uVar9 & 0xffffffff) + 4;
        builtin_strncpy(new_filename + (uVar9 & 0xffffffff),".ply",4);
      }
    }
    else {
      for (uVar9 = 0; uVar5 = uVar9, pcVar13[uVar9] != '\0'; uVar9 = uVar9 + 1) {
        new_filename[uVar9] = pcVar13[uVar9];
        lVar11 = lVar11 + -0x100000000;
      }
      do {
        lVar12 = lVar11;
        if (uVar5 - 1 == 0) break;
        lVar15 = uVar5 - 1;
        lVar11 = lVar12 + 0x100000000;
        uVar5 = uVar5 - 1;
      } while (new_filename[lVar15] != '.');
      if (new_filename[-0x100000000 - lVar12 >> 0x20] == '.') {
        lVar11 = -lVar12 >> 0x20;
        pcVar13 = new_filename + lVar11 + 3;
        (new_filename + lVar11)[0] = 's';
        (new_filename + lVar11)[1] = 't';
        new_filename[lVar11 + 2] = 'l';
      }
      else {
        pcVar13 = new_filename + (uVar9 & 0xffffffff) + 4;
        builtin_strncpy(new_filename + (uVar9 & 0xffffffff),".stl",4);
      }
    }
    *pcVar13 = '\0';
  }
  if ((bool)(triangle_normals == (float *)0x0 & bVar20)) {
    triangle_normals = (float *)malloc((ulong)(nr_of_triangles * 3) << 2);
    for (uVar9 = 0; (ulong)nr_of_triangles * 3 != uVar9; uVar9 = uVar9 + 3) {
      uVar8 = tria_indices[uVar9 & 0xffffffff];
      uVar19 = (int)uVar9 + 1;
      uVar1 = tria_indices[uVar19];
      uVar17 = (int)uVar9 + 2;
      uVar2 = tria_indices[uVar17];
      fVar24 = vertices[uVar1 * 3] - vertices[uVar8 * 3];
      fVar26 = vertices[uVar1 * 3 + 1] - vertices[uVar8 * 3 + 1];
      fVar23 = vertices[uVar1 * 3 + 2] - vertices[uVar8 * 3 + 2];
      fVar25 = vertices[uVar2 * 3] - vertices[uVar8 * 3];
      fVar22 = vertices[uVar2 * 3 + 1] - vertices[uVar8 * 3 + 1];
      fVar28 = vertices[uVar2 * 3 + 2] - vertices[uVar8 * 3 + 2];
      fVar27 = fVar26 * fVar28 - fVar22 * fVar23;
      fVar28 = fVar23 * fVar25 - fVar28 * fVar24;
      fVar23 = fVar22 * fVar24 - fVar25 * fVar26;
      fVar24 = SQRT(fVar23 * fVar23 + fVar27 * fVar27 + fVar28 * fVar28);
      bVar4 = NAN(fVar24);
      bVar21 = fVar24 == 0.0;
      fVar22 = fVar27 / fVar24;
      if ((bVar21) && (!bVar4)) {
        fVar22 = fVar27;
      }
      triangle_normals[uVar9 & 0xffffffff] = fVar22;
      fVar22 = fVar28 / fVar24;
      if ((bVar21) && (!bVar4)) {
        fVar22 = fVar28;
      }
      triangle_normals[uVar19] = fVar22;
      fVar22 = fVar23 / fVar24;
      if ((bVar21) && (!bVar4)) {
        fVar22 = fVar23;
      }
      triangle_normals[uVar17] = fVar22;
    }
  }
  if (bVar20) {
    iVar16 = trico_write_stl(vertices,tria_indices,nr_of_triangles,triangle_normals,attributes,
                             new_filename);
  }
  else {
    iVar16 = trico_write_ply(nr_of_vertices,vertices,vertex_normals,vertex_colors,nr_of_triangles,
                             tria_indices,texcoords,new_filename);
  }
  if (iVar16 != 0) {
    free(vertices);
    free(triangle_normals);
    free(vertex_normals);
    free(vertex_colors);
    free(texcoords);
    free(tria_indices);
    free(attributes);
    return 0;
  }
  __format = "Could not write to %s\n";
  pcVar13 = new_filename;
LAB_00102403:
  printf(__format,pcVar13);
  return -1;
}

Assistant:

int main(int argc, const char** argv)
  {
  if (argc < 3)
    {
    print_help();
    return -1;
    }
  const char* filename = NULL;
  int output_filename = 0;
  char new_filename[1024];
  for (int j = 1; j < argc; ++j)
    {
    if (strcmp(argv[j], "-i") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect a filename after command -i\n");
        return -1;
        }
      ++j;
      filename = argv[j];
      }
    else if (strcmp(argv[j], "-o") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect a filename after command -o\n");
        return -1;
        }
      ++j;
      const char* ptr = argv[j];
      int idx = 0;
      while (*ptr)
        new_filename[idx++] = *ptr++;
      new_filename[idx] = 0;
      output_filename = 1;
      }
    else
      {
      printf("Unknown command %s\n", argv[j]);
      return -1;
      }
    }

  if (!filename)
    {
    printf("An input file name is required\n");
    return -1;
    }


  long long size = fsize(filename);
  if (size < 0)
    {
    printf("There was an error reading file %s\n", filename);
    return -1;
    }

  FILE* f = fopen(filename, "rb");
  if (!f)
    {
    printf("Cannot open file: %s\n", filename);
    return -1;
    }
  char* buffer = (char*)malloc(size);
  long long fl = (long long)fread(buffer, 1, size, f);
  if (fl != size)
    {
    printf("There was an error reading file %s\n", filename);
    fclose(f);
    return -1;
    }
  fclose(f);

  void* arch = trico_open_archive_for_reading((const uint8_t*)buffer, size);
  if (!arch)
    {
    printf("The input file %s is not a trico archive.\n", filename);
    return -1;
    }

  float* vertices = NULL;
  uint32_t* tria_indices = NULL;
  float* triangle_normals = NULL;
  float* vertex_normals = NULL;
  uint32_t* vertex_colors = NULL;
  float* texcoords = NULL;
  uint16_t* attributes = NULL;
  uint32_t nr_of_vertices = 0;
  uint32_t nr_of_triangles = 0;
  uint32_t nr_of_triangle_normals = 0;
  uint32_t nr_of_vertex_normals = 0;
  uint32_t nr_of_vertex_colors = 0;
  uint32_t nr_of_texcoords = 0;
  uint32_t nr_of_attributes = 0;

  enum trico_stream_type st = trico_get_next_stream_type(arch);
  while (!st == trico_empty)
    {
    switch (st)
      {
      case trico_vertex_float_stream:
      {
      nr_of_vertices = trico_get_number_of_vertices(arch);
      vertices = (float*)malloc(nr_of_vertices * 3 * sizeof(float));
      if (!trico_read_vertices(arch, &vertices))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the vertices\n");
        return -1;
        }
      break;
      }
      case trico_triangle_normal_float_stream:
      {
      nr_of_triangle_normals = trico_get_number_of_normals(arch);
      triangle_normals = (float*)malloc(nr_of_triangle_normals * 3 * sizeof(float));
      if (!trico_read_triangle_normals(arch, &triangle_normals))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the triangle normals\n");
        return -1;
        }
      break;
      }
      case trico_vertex_normal_float_stream:
      {
      nr_of_vertex_normals = trico_get_number_of_normals(arch);
      vertex_normals = (float*)malloc(nr_of_vertex_normals * 3 * sizeof(float));
      if (!trico_read_vertex_normals(arch, &vertex_normals))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the vertex normals\n");
        return -1;
        }
      break;
      }
      case trico_vertex_color_stream:
      {
      nr_of_vertex_colors = trico_get_number_of_colors(arch);
      vertex_colors = (uint32_t*)malloc(nr_of_vertex_colors * sizeof(uint32_t));
      if (!trico_read_vertex_colors(arch, &vertex_colors))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the vertex colors\n");
        return -1;
        }
      break;
      }
      case trico_triangle_uint32_stream:
      {
      nr_of_triangles = trico_get_number_of_triangles(arch);
      tria_indices = (uint32_t*)malloc(nr_of_triangles * 3 * sizeof(uint32_t));
      if (!trico_read_triangles(arch, &tria_indices))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the triangles\n");
        return -1;
        }
      break;
      }
      case trico_attribute_uint16_stream:
      {
      nr_of_attributes = trico_get_number_of_attributes(arch);
      attributes = (uint16_t*)malloc(nr_of_attributes * sizeof(uint16_t));
      if (!trico_read_attributes_uint16(arch, &attributes))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the attributes\n");
        return -1;
        }
      break;
      }
      case trico_uv_per_triangle_float_stream:
      {
      nr_of_texcoords = trico_get_number_of_uvs(arch);
      texcoords = (float*)malloc(nr_of_texcoords * 2 * sizeof(float));
      if (!trico_read_uv_per_triangle(arch, &texcoords))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the texture coordinates\n");
        return -1;
        }
      break;
      }
      default:
      {
      trico_skip_next_stream(arch);
      break;
      }
      }

    st = trico_get_next_stream_type(arch);
    }

  trico_close_archive(arch);
  free(buffer);

  int output_as_stl = 0;
  int output_as_ply = 0;

  if (output_filename)
    {
    output_as_stl = extension_is_stl(new_filename);
    output_as_ply = extension_is_ply(new_filename);
    }

  if (!output_as_stl && !output_as_ply)
    {
    if (vertex_colors || texcoords || vertex_normals)
      output_as_ply = 1;
    else
      output_as_stl = 1;
    }

  if (!output_filename)
    {
    if (output_as_ply)
      change_extension_to_ply(new_filename, filename);
    else
      change_extension_to_stl(new_filename, filename);
    }

  if (output_as_stl && (triangle_normals == NULL))
    {
    triangle_normals = (float*)malloc(nr_of_triangles * 3 * sizeof(float));
    for (uint32_t t = 0; t < nr_of_triangles; ++t)
      {
      const uint32_t v0 = tria_indices[t * 3];
      const uint32_t v1 = tria_indices[t * 3 + 1];
      const uint32_t v2 = tria_indices[t * 3 + 2];
      const float x0 = vertices[v0 * 3];
      const float y0 = vertices[v0 * 3 + 1];
      const float z0 = vertices[v0 * 3 + 2];
      const float x1 = vertices[v1 * 3];
      const float y1 = vertices[v1 * 3 + 1];
      const float z1 = vertices[v1 * 3 + 2];
      const float x2 = vertices[v2 * 3];
      const float y2 = vertices[v2 * 3 + 1];
      const float z2 = vertices[v2 * 3 + 2];
      const float ax = x1 - x0;
      const float ay = y1 - y0;
      const float az = z1 - z0;
      const float bx = x2 - x0;
      const float by = y2 - y0;
      const float bz = z2 - z0;
      const float nx = ay * bz - az * by;
      const float ny = az * bx - ax * bz;
      const float nz = ax * by - ay * bx;
      const float length = (float)sqrt((double)(nx*nx + ny * ny + nz * nz));
      triangle_normals[t * 3] = length ? nx / length : nx;
      triangle_normals[t * 3 + 1] = length ? ny / length : ny;
      triangle_normals[t * 3 + 2] = length ? nz / length : nz;
      }
    }

  if (output_as_stl)
    {
    if (!trico_write_stl(vertices, tria_indices, nr_of_triangles, triangle_normals, attributes, new_filename))
      {
      printf("Could not write to %s\n", new_filename);
      return -1;
      }
    }
  else
    {
    if (!trico_write_ply(nr_of_vertices, vertices, vertex_normals, vertex_colors, nr_of_triangles, tria_indices, texcoords, new_filename))
      {
      printf("Could not write to %s\n", new_filename);
      return -1;
      }
    }
  
  free(vertices);
  free(triangle_normals);
  free(vertex_normals);
  free(vertex_colors);
  free(texcoords);
  free(tria_indices);
  free(attributes);
  return 0;
  }